

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmidiin.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  undefined8 extraout_RAX;
  RtMidiIn *unaff_RBX;
  ulong uVar5;
  ulong uVar6;
  allocator<char> local_85;
  uint local_84;
  RtMidiIn *local_80;
  string local_78 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  
  message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc < 3) {
    unaff_RBX = (RtMidiIn *)operator_new(0x10);
    std::__cxx11::string::string<std::allocator<char>>(local_78,"RtMidi Input Client",&local_85);
    RtMidiIn::RtMidiIn(unaff_RBX,0,local_78,100);
    std::__cxx11::string::~string(local_78);
    uVar2 = (**(code **)(*(long *)unaff_RBX + 0x10))(unaff_RBX);
    uVar3 = 0;
    if (argc == 2) {
      uVar3 = atoi(argv[1]);
    }
    if (uVar3 < uVar2) {
      local_80 = unaff_RBX;
      std::__cxx11::string::string<std::allocator<char>>(local_78,"RtMidi Input",&local_85);
      (*(code *)**(undefined8 **)unaff_RBX)(unaff_RBX,uVar3,local_78);
      std::__cxx11::string::~string(local_78);
      (**(code **)(**(long **)(unaff_RBX + 8) + 0x58))(*(long **)(unaff_RBX + 8),0,0,0);
      done = false;
      signal(2,finish);
      poVar4 = std::operator<<((ostream *)&std::cout,"Reading MIDI from port ");
      (**(code **)(*(long *)unaff_RBX + 0x18))(local_78,unaff_RBX,0);
      poVar4 = std::operator<<(poVar4,local_78);
      std::operator<<(poVar4," ... quit with Ctrl-C.\n");
      std::__cxx11::string::~string(local_78);
      while (done == false) {
        dVar1 = RtMidiIn::getMessage(local_80,&message);
        local_84 = (int)message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                   (int)message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
        uVar5 = 0;
        if (0 < (int)local_84) {
          uVar5 = (ulong)local_84;
        }
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Byte ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar6);
          poVar4 = std::operator<<(poVar4," = ");
          poVar4 = (ostream *)
                   std::ostream::operator<<
                             (poVar4,(uint)message.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar6]);
          std::operator<<(poVar4,", ");
        }
        if (0 < (int)local_84) {
          std::operator<<((ostream *)&std::cout,"stamp = ");
          poVar4 = std::ostream::_M_insert<double>(dVar1);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        usleep(10000);
      }
      (**(code **)(*(long *)local_80 + 0x40))();
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return 0;
    }
  }
  else {
    usage();
  }
  (**(code **)(*(long *)unaff_RBX + 0x40))(unaff_RBX);
  std::operator<<((ostream *)&std::cout,"Invalid port specifier!\n");
  usage();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main( int argc, char *argv[] )
{
  RtMidiIn *midiin = 0;
  std::vector<unsigned char> message;
  int nBytes, i;
  double stamp;

  // Minimal command-line check.
  if ( argc > 2 ) usage();

  // RtMidiIn constructor
  try {
    midiin = new RtMidiIn();
  }
  catch ( RtMidiError &error ) {
    error.printMessage();
    exit( EXIT_FAILURE );
  }

  // Check available ports vs. specified.
  unsigned int port = 0;
  unsigned int nPorts = midiin->getPortCount();
  if ( argc == 2 ) port = (unsigned int) atoi( argv[1] );
  if ( port >= nPorts ) {
    delete midiin;
    std::cout << "Invalid port specifier!\n";
    usage();
  }

  try {
    midiin->openPort( port );
  }
  catch ( RtMidiError &error ) {
    error.printMessage();
    goto cleanup;
  }

  // Don't ignore sysex, timing, or active sensing messages.
  midiin->ignoreTypes( false, false, false );

  // Install an interrupt handler function.
  done = false;
  (void) signal(SIGINT, finish);

  // Periodically check input queue.
  std::cout << "Reading MIDI from port " << midiin->getPortName() << " ... quit with Ctrl-C.\n";
  while ( !done ) {
    stamp = midiin->getMessage( &message );
    nBytes = message.size();
    for ( i=0; i<nBytes; i++ )
      std::cout << "Byte " << i << " = " << (int)message[i] << ", ";
    if ( nBytes > 0 )
      std::cout << "stamp = " << stamp << std::endl;

    // Sleep for 10 milliseconds.
    SLEEP( 10 );
  }

  // Clean up
 cleanup:
  delete midiin;

  return 0;
}